

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.cc
# Opt level: O2

void down_heap(OPENSSL_STACK *sk,OPENSSL_sk_call_cmp_func call_cmp_func,size_t i,size_t num)

{
  ulong uVar1;
  void **ppvVar2;
  void *pvVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  
  if ((num <= i) || (sk->num < num)) {
    __assert_fail("i < num && num <= sk->num",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/stack/stack.cc"
                  ,0x173,"void down_heap(OPENSSL_STACK *, OPENSSL_sk_call_cmp_func, size_t, size_t)"
                 );
  }
  while( true ) {
    if ((long)i < 0) {
      __assert_fail("idx <= PTRDIFF_MAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/stack/stack.cc"
                    ,0x16a,"size_t left_idx(size_t)");
    }
    uVar5 = i * 2 + 1;
    if (num <= uVar5) break;
    iVar4 = (*call_cmp_func)(sk->comp,sk->data[i],sk->data[uVar5]);
    if (-1 < iVar4) {
      uVar5 = i;
    }
    uVar1 = i * 2 + 2;
    uVar6 = uVar5;
    if ((uVar1 < num) &&
       (iVar4 = (*call_cmp_func)(sk->comp,sk->data[uVar5],sk->data[i * 2 + 2]), uVar6 = uVar1,
       -1 < iVar4)) {
      uVar6 = uVar5;
    }
    if (i == uVar6) {
      return;
    }
    ppvVar2 = sk->data;
    pvVar3 = ppvVar2[i];
    ppvVar2[i] = ppvVar2[uVar6];
    sk->data[uVar6] = pvVar3;
    i = uVar6;
  }
  return;
}

Assistant:

static void down_heap(OPENSSL_STACK *sk, OPENSSL_sk_call_cmp_func call_cmp_func,
                      size_t i, size_t num) {
  assert(i < num && num <= sk->num);
  for (;;) {
    size_t left = left_idx(i);
    if (left >= num) {
      break;  // No left child.
    }

    // Swap |i| with the largest of its children.
    size_t next = i;
    if (call_cmp_func(sk->comp, sk->data[next], sk->data[left]) < 0) {
      next = left;
    }
    size_t right = left + 1;  // Cannot overflow because |left < num|.
    if (right < num &&
        call_cmp_func(sk->comp, sk->data[next], sk->data[right]) < 0) {
      next = right;
    }

    if (i == next) {
      break;  // |i| is already larger than its children.
    }

    void *tmp = sk->data[i];
    sk->data[i] = sk->data[next];
    sk->data[next] = tmp;
    i = next;
  }
}